

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_DamageSelf
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int amount;
  int selector;
  bool bVar1;
  AActor *source;
  AActor *inflictor;
  int iVar2;
  int selector_00;
  char *pcVar3;
  AActor *origin;
  int iVar4;
  int local_44;
  PClassActor *local_40;
  FName local_38;
  FName local_34;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_003ec943;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ec914:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ec943:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16c6,
                  "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003ec754;
    bVar1 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ec943;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003ec914;
LAB_003ec754:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
LAB_003ec96b:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16c7,
                  "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar3 = "param[paramnum].Type == REGT_INT";
    goto LAB_003ec96b;
  }
  amount = param[1].field_0.i;
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003ec9f9;
    }
    iVar4 = param[2].field_0.i;
LAB_003ec7a7:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eca18:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16c9,
                    "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_44 = param[3].field_0.i;
LAB_003ec7b6:
    if (param[4].field_0.field_3.Type != '\x03') {
LAB_003ec91d:
      pcVar3 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003ec924:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16ca,
                    "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_40 = (PClassActor *)param[4].field_0.field_1.a;
    if (param[4].field_0.field_1.atag != 1) {
      if (local_40 != (PClassActor *)0x0) goto LAB_003ec91d;
      local_40 = (PClassActor *)0x0;
    }
LAB_003ec7d8:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ec9c8:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16cb,
                    "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = param[5].field_0.i;
LAB_003ec7e7:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ec9a9:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16cc,
                    "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    selector_00 = param[6].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
LAB_003ec9f9:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16c8,
                    "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar4 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003ec7a7;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eca18;
    }
    local_44 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003ec7b6;
    }
    if ((param[4].field_0.field_3.Type != '\x03') ||
       (local_40 = (PClassActor *)param[4].field_0.field_1.a,
       local_40 != (PClassActor *)0x0 && param[4].field_0.field_1.atag != 1)) {
      pcVar3 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003ec924;
    }
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003ec7d8;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ec9c8;
    }
    iVar2 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003ec7e7;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ec9a9;
    }
    selector_00 = param[6].field_0.i;
    if (numparam != 7) {
      if (param[7].field_0.field_3.Type != '\0') {
        pcVar3 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003ec98a;
      }
      goto LAB_003ec80d;
    }
    param = defaultparam->Array;
  }
  if (param[7].field_0.field_3.Type != '\0') {
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ec98a:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16cd,
                  "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003ec80d:
  selector = param[7].field_0.i;
  source = COPY_AAPTR(origin,selector_00);
  inflictor = COPY_AAPTR(origin,selector);
  local_38.Index = iVar2;
  local_34.Index = iVar4;
  DoDamage(origin,inflictor,source,amount,&local_34,local_44,local_40,&local_38);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DamageSelf)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(amount);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	DoDamage(self, inflictor, source, amount, damagetype, flags, filter, species);
	return 0;
}